

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int inet_pton4(char *src,uchar *dst)

{
  uint uVar1;
  char *pcVar2;
  uint *in_RSI;
  char *in_RDI;
  uint nw;
  char *pch;
  uchar *tp;
  uchar tmp [4];
  int ch;
  int octets;
  int saw_digit;
  uint *local_30;
  uint local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint *local_18;
  char *local_10;
  int local_4;
  
  local_1c = 0;
  local_20 = 0;
  local_28 = local_28 & 0xffffff00;
  local_30 = &local_28;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    while( true ) {
      local_24 = (int)*local_10;
      if (local_24 == 0) {
        if (local_20 < 4) {
          local_4 = -0x16;
        }
        else {
          *local_18 = local_28;
          local_4 = 0;
        }
        return local_4;
      }
      local_10 = local_10 + 1;
      pcVar2 = strchr("0123456789",local_24);
      if (pcVar2 == (char *)0x0) break;
      uVar1 = (uint)(byte)*local_30 * 10 + (int)pcVar2 + -0x12212c;
      if ((local_1c != 0) && ((byte)*local_30 == 0)) {
        return -0x16;
      }
      if (0xff < uVar1) {
        return -0x16;
      }
      *(byte *)local_30 = (byte)uVar1;
      if (local_1c == 0) {
        local_20 = local_20 + 1;
        if (4 < local_20) {
          return -0x16;
        }
        local_1c = 1;
      }
    }
    if ((local_24 != 0x2e) || (local_1c == 0)) break;
    if (local_20 == 4) {
      return -0x16;
    }
    *(byte *)((long)local_30 + 1) = 0;
    local_1c = 0;
    local_30 = (uint *)((long)local_30 + 1);
  }
  return -0x16;
}

Assistant:

static int inet_pton4(const char *src, unsigned char *dst) {
  static const char digits[] = "0123456789";
  int saw_digit, octets, ch;
  unsigned char tmp[sizeof(struct in_addr)], *tp;

  saw_digit = 0;
  octets = 0;
  *(tp = tmp) = 0;
  while ((ch = *src++) != '\0') {
    const char *pch;

    if ((pch = strchr(digits, ch)) != NULL) {
      unsigned int nw = *tp * 10 + (pch - digits);

      if (saw_digit && *tp == 0)
        return UV_EINVAL;
      if (nw > 255)
        return UV_EINVAL;
      *tp = nw;
      if (!saw_digit) {
        if (++octets > 4)
          return UV_EINVAL;
        saw_digit = 1;
      }
    } else if (ch == '.' && saw_digit) {
      if (octets == 4)
        return UV_EINVAL;
      *++tp = 0;
      saw_digit = 0;
    } else
      return UV_EINVAL;
  }
  if (octets < 4)
    return UV_EINVAL;
  memcpy(dst, tmp, sizeof(struct in_addr));
  return 0;
}